

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

bool CleanAndRemoveFileName
               (wchar_t *dirty_path,bool bPathIncludesFileName,ON_wString *volume,
               ON_wString *clean_path,ON_wString *file_name)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t **fname;
  ulong string_length;
  ON_wString path;
  wchar_t *f;
  wchar_t *d;
  wchar_t *v;
  ON_wString local_50;
  wchar_t *local_48;
  wchar_t *local_40;
  wchar_t *local_38;
  
  ON_FileSystemPath::CleanPath((ON_FileSystemPath *)&local_50,dirty_path);
  bVar1 = ON_wString::IsEmpty(&local_50);
  if (!bVar1) {
    if (!bPathIncludesFileName) {
      iVar2 = ON_wString::Length(&local_50);
      pwVar3 = ON_wString::operator[](&local_50,iVar2 + -1);
      if ((*pwVar3 != L'/') && (*pwVar3 != L'\\')) {
        ON_wString::operator+=(&local_50,L'/');
      }
    }
    pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_50);
    local_38 = (wchar_t *)0x0;
    local_40 = (wchar_t *)0x0;
    local_48 = (wchar_t *)0x0;
    fname = &local_48;
    if (!bPathIncludesFileName) {
      fname = (wchar_t **)0x0;
    }
    on_wsplitpath(pwVar3,&local_38,&local_40,fname,(wchar_t **)0x0);
    if ((local_40 != (wchar_t *)0x0) && (*local_40 != L'\0')) {
      ON_wString::operator=(clean_path,local_40);
      if (!bPathIncludesFileName) {
        if (file_name != (ON_wString *)0x0) {
          ON_wString::operator=(file_name,&ON_wString::EmptyString);
        }
LAB_0048fec7:
        bVar1 = true;
        goto LAB_0048fe98;
      }
      if ((local_48 != (wchar_t *)0x0) && (*local_48 != L'\0')) {
        iVar2 = ON_wString::Length(&local_50);
        if ((((iVar2 != 0) &&
             ((pwVar3 <= local_40 && (local_48 < pwVar3 + iVar2 && local_40 < local_48)))) &&
            ((local_48[-1] == L'\\' || (local_48[-1] == L'/')))) &&
           (string_length = (long)local_48 - (long)local_40 >> 2, 1 < string_length)) {
          iVar2 = ON_wString::Length(clean_path);
          if (string_length < (ulong)(long)iVar2) {
            if (file_name != (ON_wString *)0x0) {
              ON_wString::operator=(file_name,local_48);
            }
            ON_wString::SetLength(clean_path,string_length);
            goto LAB_0048fec7;
          }
        }
      }
    }
  }
  ON_wString::operator=(volume,&ON_wString::EmptyString);
  ON_wString::operator=(clean_path,&ON_wString::EmptyString);
  if (file_name != (ON_wString *)0x0) {
    ON_wString::operator=(file_name,&ON_wString::EmptyString);
  }
  bVar1 = false;
LAB_0048fe98:
  ON_wString::~ON_wString(&local_50);
  return bVar1;
}

Assistant:

static bool CleanAndRemoveFileName(
  const wchar_t* dirty_path,
  bool bPathIncludesFileName,
  ON_wString& volume,
  ON_wString& clean_path,
  ON_wString* file_name
  )
{
  ON_wString path = ON_FileSystemPath::CleanPath(dirty_path);
  for (;;)
  {
    if (path.IsEmpty())
      break;

    if (false == bPathIncludesFileName && false == IsDirSep(path[path.Length() - 1]))
      path += ON_FileSystemPath::DirectorySeparator;

    const wchar_t* p = static_cast<const wchar_t*>(path);
    const wchar_t* v = nullptr;
    const wchar_t* d = nullptr;
    const wchar_t* f = nullptr;
    on_wsplitpath(p, &v, &d, bPathIncludesFileName ? &f : nullptr, nullptr);

    if (nullptr == d || 0 == d[0])
      break;
    
    clean_path = d;

    if (bPathIncludesFileName)
    {
      // remove trailing file name from base_path.
      if (nullptr == f || 0 == f[0])
        break;
      const size_t path_length = (size_t)path.Length();
      if  ( path_length <= 0 )
        break;
      if (!(p <= d && d < f && f < p + path_length))
        break;
      if (!IsDirSep(f[-1]))
        break;
      size_t len = (f - d);
      if (len <= 1 || len >= (size_t)clean_path.Length())
        break;
      if ( nullptr != file_name )
        *file_name = f;
      clean_path.SetLength(len);
    }
    else
    {
      if ( nullptr != file_name )
        *file_name = ON_wString::EmptyString;
    }

    return true;
  }

  volume = ON_wString::EmptyString;
  clean_path = ON_wString::EmptyString;
  if ( nullptr != file_name )
    *file_name = ON_wString::EmptyString;
  return false;
}